

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void glcts::anon_unknown_0::ShaderSourceFactory::streamUniformDefinitions
               (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                *uniforms,GLenum shader,ostringstream *ret)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pUVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  pUVar4 = (uniforms->
           super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((uniforms->
      super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      )._M_impl.super__Vector_impl_data._M_finish != pUVar4) {
    uVar7 = 0;
    do {
      bVar2 = DefOccurence::occurs
                        ((DefOccurence *)(ulong)pUVar4[uVar7].declOccurence.occurence,shader);
      if (bVar2) {
        pUVar4 = (uniforms->
                 super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        cVar1 = (char)ret;
        if (pUVar4[uVar7].type.baseType == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"struct ",7);
          pUVar4 = (uniforms->
                   super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                              pUVar4[uVar7].type.strType._M_dataplus._M_p,
                              pUVar4[uVar7].type.strType._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," {",2);
          std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          pUVar4 = (uniforms->
                   super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(long)pUVar4[uVar7].type.arraySize <=
              (ulong)(((long)*(pointer *)
                              ((long)&pUVar4[uVar7].childUniforms.
                                      super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                      ._M_impl + 8) -
                       *(long *)&pUVar4[uVar7].childUniforms.
                                 super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                 ._M_impl >> 3) * -0x34115b1e5f75270d)) {
            lVar5 = 0;
            uVar6 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"    ",4);
              Uniform::streamDefinition
                        ((Uniform *)
                         (*(long *)&(uniforms->
                                    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar7].childUniforms.
                                    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                    ._M_impl + lVar5),ret);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&ret->super_basic_ostream<char,_std::char_traits<char>_>,";",1);
              std::ios::widen((char)(ret->super_basic_ostream<char,_std::char_traits<char>_>).
                                    _vptr_basic_ostream[-3] + cVar1);
              std::ostream::put(cVar1);
              std::ostream::flush();
              uVar6 = uVar6 + 1;
              pUVar4 = (uniforms->
                       super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar5 = lVar5 + 0x1d8;
            } while (uVar6 < (ulong)(((long)*(pointer *)
                                             ((long)&pUVar4[uVar7].childUniforms.
                                                                                                          
                                                  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                                  ._M_impl + 8) -
                                      *(long *)&pUVar4[uVar7].childUniforms.
                                                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                                ._M_impl >> 3) * -0x34115b1e5f75270d) /
                             (ulong)(long)pUVar4[uVar7].type.arraySize);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"};",2);
          std::ios::widen((char)(ret->super_basic_ostream<char,_std::char_traits<char>_>).
                                _vptr_basic_ostream[-3] + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          pUVar4 = (uniforms->
                   super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::streamDefinition
                  (&pUVar4[uVar7].location,ret,shader);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"uniform ",8);
        Uniform::streamDefinition
                  ((uniforms->
                   super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar7,ret);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&ret->super_basic_ostream<char,_std::char_traits<char>_>,";",1);
        std::ios::widen((char)(ret->super_basic_ostream<char,_std::char_traits<char>_>).
                              _vptr_basic_ostream[-3] + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
      }
      uVar7 = uVar7 + 1;
      pUVar4 = (uniforms->
               super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)(((long)(uniforms->
                                    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4 >> 3)
                            * -0x34115b1e5f75270d));
  }
  return;
}

Assistant:

static void streamUniformDefinitions(const std::vector<Uniform>& uniforms, GLenum shader, std::ostringstream& ret)
	{
		for (size_t i = 0; i < uniforms.size(); i++)
		{
			if (uniforms[i].declOccurence.occurs(shader))
			{
				if (uniforms[i].type.isStruct())
				{
					ret << "struct " << uniforms[i].type.str() << " {" << std::endl;
					for (size_t child = 0; child < uniforms[i].childUniforms.size() / uniforms[i].type.arraySize;
						 child++)
					{
						ret << "    ";
						uniforms[i].childUniforms[child].streamDefinition(ret);
						ret << ";" << std::endl;
					}
					ret << "};" << std::endl;
				}
				uniforms[i].location.streamDefinition(ret, shader);
				ret << "uniform ";
				uniforms[i].streamDefinition(ret);
				ret << ";" << std::endl;
			}
		}
	}